

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

float nk_cos(float x)

{
  float x_local;
  
  return x * (x * (x * (x * (x * (x * (x * -5.2302214e-14 + 0.000990141) + -0.018663716) + 0.1071238
                            ) + -0.11813404) + -0.39438233) + -0.038191997) + 1.002386;
}

Assistant:

NK_INTERN float
nk_cos(float x)
{
    NK_STORAGE const float a0 = +1.00238601909309722f;
    NK_STORAGE const float a1 = -3.81919947353040024e-2f;
    NK_STORAGE const float a2 = -3.94382342128062756e-1f;
    NK_STORAGE const float a3 = -1.18134036025221444e-1f;
    NK_STORAGE const float a4 = +1.07123798512170878e-1f;
    NK_STORAGE const float a5 = -1.86637164165180873e-2f;
    NK_STORAGE const float a6 = +9.90140908664079833e-4f;
    NK_STORAGE const float a7 = -5.23022132118824778e-14f;
    return a0 + x*(a1 + x*(a2 + x*(a3 + x*(a4 + x*(a5 + x*(a6 + x*a7))))));
}